

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

ostream * __thiscall amrex::BoxArray::writeOn(BoxArray *this,ostream *os)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ostream *poVar5;
  Long LVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  element_type *in_RSI;
  BATransformer *in_RDI;
  int i_2;
  Box result;
  Box bx;
  int i_1;
  IntVect cr;
  IndexType t;
  int i;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *bxs;
  int N;
  int dir;
  IntVect off;
  int off_1;
  uint bitval;
  uint typ;
  int dir_1;
  BoxArray *in_stack_fffffffffffffc08;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_fffffffffffffc10;
  BoxArray *in_stack_fffffffffffffc20;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  int local_3c4;
  int in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc44;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  int local_3b0;
  int local_3ac;
  int local_39c;
  int local_398;
  int local_394;
  int local_38c;
  int local_388;
  int local_384;
  int local_37c;
  int local_378;
  int local_374;
  int local_364;
  int local_360;
  int local_35c;
  int local_354;
  int local_350;
  int local_34c;
  int local_344;
  int local_340;
  int local_33c;
  Box *in_stack_fffffffffffffcd8;
  BATbndryReg *in_stack_fffffffffffffce0;
  undefined8 *puVar10;
  undefined8 *puVar11;
  int local_2d0;
  undefined8 local_2cc;
  undefined8 local_2c4;
  undefined8 local_2bc;
  uint local_2b4;
  BoxArray local_2b0;
  char *local_248;
  uint local_23c;
  undefined1 *local_238;
  undefined8 *local_230;
  int *local_228;
  Box *local_220;
  int local_218;
  IntVect local_214;
  int *local_208;
  undefined8 *local_200;
  int local_1f8;
  uint local_1f4;
  uint local_1f0;
  int local_1ec;
  BoxArray *local_1e8;
  uint local_1dc;
  uint local_1d8;
  int local_1d4;
  undefined1 *local_1d0;
  int local_1c4;
  long local_1c0;
  int local_1b4;
  int *local_1b0;
  IntVect *local_1a8;
  int *local_1a0;
  undefined4 local_194;
  IntVect *local_190;
  undefined4 local_184;
  IntVect *local_180;
  undefined4 local_174;
  IntVect *local_170;
  undefined4 local_164;
  int *local_160;
  int *local_158;
  int *local_150;
  int *local_148;
  long local_140;
  int *local_138;
  undefined8 *local_130;
  uint *local_128;
  int local_11c;
  undefined1 *local_118;
  int local_10c;
  uint *local_108;
  int local_fc;
  uint *local_f8;
  undefined4 local_f0;
  int local_ec;
  IntVect *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  uint *local_70;
  int local_64;
  uint *local_60;
  int local_54;
  undefined1 *local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  undefined1 *local_30;
  int local_24;
  undefined1 *local_20;
  int local_18;
  int local_14;
  undefined1 *local_10;
  int local_4;
  
  local_2b0.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RSI;
  poVar5 = std::operator<<((ostream *)in_RSI,'(');
  LVar6 = size((BoxArray *)0x12566ee);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,LVar6);
  poVar5 = std::operator<<(poVar5,' ');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
  std::operator<<(poVar5,'\n');
  LVar6 = size((BoxArray *)0x125672f);
  local_2b0.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = (int)LVar6;
  local_2b0.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                 ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  0x1256747);
  bVar4 = BATransformer::is_null(in_RDI);
  if (bVar4) {
    for (local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[2] = 0;
        local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[2] <
        local_2b0.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_;
        local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[2] =
             local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[2] + 1) {
      Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                (in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08);
      poVar5 = amrex::operator<<((ostream *)
                                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                 (Box *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40
                                                ));
      std::operator<<(poVar5,'\n');
    }
  }
  else {
    bVar4 = BATransformer::is_simple(in_RDI);
    if (bVar4) {
      local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[1] = (int)ixType(in_stack_fffffffffffffc08);
      local_2b0.m_bat.m_op._28_12_ = (undefined1  [12])crseRatio(in_stack_fffffffffffffc20);
      local_2b0.m_bat.m_op._48_8_ = local_2b0.m_bat.m_op._28_8_;
      local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] =
           local_2b0.m_bat.m_op.m_bndryReg.m_hishft.vect[1];
      for (local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[1] = 0;
          local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[1] <
          local_2b0.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_;
          local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[1] =
               local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[1] + 1) {
        local_220 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                              (in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08);
        local_228 = local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect + 1;
        lVar2 = *(long *)(local_220->smallend).vect;
        local_2c4 = *(long *)((local_220->smallend).vect + 2);
        lVar3 = *(long *)((local_220->bigend).vect + 1);
        uVar1 = (local_220->btype).itype;
        puVar10 = &local_2cc;
        local_164 = 1;
        bVar4 = true;
        if ((local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1] == 1) &&
           (bVar4 = true, local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2] == 1)) {
          bVar4 = local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] != 1;
        }
        local_2cc = lVar2;
        local_2bc = lVar3;
        local_208 = local_228;
        local_200 = puVar10;
        local_160 = local_228;
        if (bVar4) {
          local_2cc._0_4_ = (int)lVar2;
          local_c4 = (int)local_2cc;
          local_c8 = local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1];
          local_c0 = local_c4;
          if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1] != 1) {
            if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1] == 2) {
              if ((int)local_2cc < 0) {
                iVar9 = (int)local_2cc + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                local_33c = -iVar9 / 2 + -1;
              }
              else {
                local_33c = (int)local_2cc / 2;
              }
              local_c0 = local_33c;
            }
            else if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1] == 4) {
              if ((int)local_2cc < 0) {
                iVar9 = (int)local_2cc + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                local_340 = -iVar9 / 4 + -1;
              }
              else {
                local_340 = (int)local_2cc / 4;
              }
              local_c0 = local_340;
            }
            else {
              if ((int)local_2cc < 0) {
                iVar9 = (int)local_2cc + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                local_344 = -iVar9 / local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1] + -1;
              }
              else {
                local_344 = (int)local_2cc / local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1];
              }
              local_c0 = local_344;
            }
          }
          local_2cc._4_4_ = (int)((ulong)lVar2 >> 0x20);
          local_d0 = local_2cc._4_4_;
          local_2cc._0_4_ = local_c0;
          local_d4 = local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2];
          local_cc = local_d0;
          if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2] != 1) {
            if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2] == 2) {
              if (lVar2 < 0) {
                iVar9 = local_d0 + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                local_34c = -iVar9 / 2 + -1;
              }
              else {
                local_34c = local_d0 / 2;
              }
              local_cc = local_34c;
            }
            else if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2] == 4) {
              if (lVar2 < 0) {
                iVar9 = local_d0 + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                local_350 = -iVar9 / 4 + -1;
              }
              else {
                local_350 = local_d0 / 4;
              }
              local_cc = local_350;
            }
            else {
              if (lVar2 < 0) {
                iVar9 = local_d0 + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                local_354 = -iVar9 / local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2] + -1;
              }
              else {
                local_354 = local_d0 / local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2];
              }
              local_cc = local_354;
            }
          }
          local_2cc._4_4_ = local_cc;
          local_dc = (int)local_2c4;
          local_e0 = local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0];
          local_d8 = local_dc;
          if (local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] != 1) {
            if (local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] == 2) {
              if ((int)local_2c4 < 0) {
                iVar9 = (int)local_2c4 + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                local_35c = -iVar9 / 2 + -1;
              }
              else {
                local_35c = (int)local_2c4 / 2;
              }
              local_d8 = local_35c;
            }
            else if (local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] == 4) {
              if ((int)local_2c4 < 0) {
                iVar9 = (int)local_2c4 + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                local_360 = -iVar9 / 4 + -1;
              }
              else {
                local_360 = (int)local_2c4 / 4;
              }
              local_d8 = local_360;
            }
            else {
              if ((int)local_2c4 < 0) {
                iVar9 = (int)local_2c4 + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                local_364 = -iVar9 / local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] + -1;
              }
              else {
                local_364 = (int)local_2c4 / local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0];
              }
              local_d8 = local_364;
            }
          }
          local_2c4._0_4_ = local_d8;
          local_128 = &local_2b4;
          local_138 = local_228;
          local_130 = puVar10;
          if (local_2b4 == 0) {
            local_140 = (long)&local_2c4 + 4;
            local_a0 = local_2c4._4_4_;
            local_a4 = local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1];
            local_9c = local_a0;
            if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1] != 1) {
              if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1] == 2) {
                if (local_2c4 < 0) {
                  iVar9 = local_2c4._4_4_ + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_3ac = -iVar9 / 2 + -1;
                }
                else {
                  local_3ac = local_2c4._4_4_ / 2;
                }
                local_9c = local_3ac;
              }
              else if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1] == 4) {
                if (local_2c4 < 0) {
                  iVar9 = local_2c4._4_4_ + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_3b0 = -iVar9 / 4 + -1;
                }
                else {
                  local_3b0 = local_2c4._4_4_ / 4;
                }
                local_9c = local_3b0;
              }
              else if (local_2c4 < 0) {
                iVar9 = local_2c4._4_4_ + 1;
                if (iVar9 < 1) {
                  iVar9 = -iVar9;
                }
                in_stack_fffffffffffffc4c =
                     -iVar9 / local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1] + -1;
                local_9c = in_stack_fffffffffffffc4c;
              }
              else {
                in_stack_fffffffffffffc4c =
                     local_2c4._4_4_ / local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[1];
                local_9c = in_stack_fffffffffffffc4c;
              }
            }
            local_2c4._4_4_ = local_9c;
            local_2bc._0_4_ = (int)lVar3;
            local_ac = (int)local_2bc;
            local_b0 = local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2];
            local_a8 = local_ac;
            if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2] != 1) {
              if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2] == 2) {
                if ((int)local_2bc < 0) {
                  iVar9 = (int)local_2bc + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  in_stack_fffffffffffffc44 = -iVar9 / 2 + -1;
                  local_a8 = in_stack_fffffffffffffc44;
                }
                else {
                  in_stack_fffffffffffffc44 = (int)local_2bc / 2;
                  local_a8 = in_stack_fffffffffffffc44;
                }
              }
              else if (local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2] == 4) {
                if ((int)local_2bc < 0) {
                  iVar9 = (int)local_2bc + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  in_stack_fffffffffffffc40 = -iVar9 / 4 + -1;
                  local_a8 = in_stack_fffffffffffffc40;
                }
                else {
                  in_stack_fffffffffffffc40 = (int)local_2bc / 4;
                  local_a8 = in_stack_fffffffffffffc40;
                }
              }
              else {
                if ((int)local_2bc < 0) {
                  iVar9 = (int)local_2bc + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_3c4 = -iVar9 / local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2] + -1;
                }
                else {
                  local_3c4 = (int)local_2bc / local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2];
                }
                local_a8 = local_3c4;
              }
            }
            local_2bc._4_4_ = (int)((ulong)lVar3 >> 0x20);
            local_b8 = local_2bc._4_4_;
            local_2bc._0_4_ = local_a8;
            local_bc = local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0];
            local_b4 = local_b8;
            if (local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] != 1) {
              if (local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] == 2) {
                if (lVar3 < 0) {
                  iVar9 = local_b8 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_3cc = -iVar9 / 2 + -1;
                }
                else {
                  local_3cc = local_b8 / 2;
                }
                local_b4 = local_3cc;
              }
              else if (local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] == 4) {
                if (lVar3 < 0) {
                  iVar9 = local_b8 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_3d0 = -iVar9 / 4 + -1;
                }
                else {
                  local_3d0 = local_b8 / 4;
                }
                local_b4 = local_3d0;
              }
              else {
                if (lVar3 < 0) {
                  iVar9 = local_b8 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_3d4 = -iVar9 / local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0] + -1;
                }
                else {
                  local_3d4 = local_b8 / local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[0];
                }
                local_b4 = local_3d4;
              }
            }
            local_2bc._4_4_ = local_b4;
            in_stack_fffffffffffffc48 = local_2b0.m_bat.m_op.m_bndryReg.m_doilo.vect[2];
            local_2bc = local_2bc;
            local_148 = local_228;
          }
          else {
            local_2b4 = uVar1;
            IntVect::IntVect(&local_214,0);
            for (local_218 = 0; local_218 < 3; local_218 = local_218 + 1) {
              local_f8 = (uint *)(puVar10 + 3);
              local_fc = local_218;
              local_74 = local_218;
              local_3c = local_218;
              if ((*local_f8 & 1 << ((byte)local_218 & 0x1f)) != 0) {
                local_1c0 = (long)puVar10 + 0xc;
                local_1c4 = local_218;
                local_1b0 = local_208;
                local_1b4 = local_218;
                if (*(int *)(local_1c0 + (long)local_218 * 4) % local_208[local_218] != 0) {
                  local_e8 = &local_214;
                  local_ec = local_218;
                  local_f0 = 1;
                  local_e8->vect[local_218] = 1;
                }
              }
              local_70 = local_f8;
            }
            local_150 = (int *)((long)puVar10 + 0xc);
            local_158 = local_208;
            local_7c = *local_150;
            local_80 = *local_208;
            local_78 = local_7c;
            if (local_80 != 1) {
              if (local_80 == 2) {
                if (local_7c < 0) {
                  iVar9 = local_7c + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_374 = -iVar9 / 2 + -1;
                }
                else {
                  local_374 = local_7c / 2;
                }
                local_78 = local_374;
              }
              else if (local_80 == 4) {
                if (local_7c < 0) {
                  iVar9 = local_7c + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_378 = -iVar9 / 4 + -1;
                }
                else {
                  local_378 = local_7c / 4;
                }
                local_78 = local_378;
              }
              else {
                if (local_7c < 0) {
                  iVar9 = local_7c + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_37c = -iVar9 / local_80 + -1;
                }
                else {
                  local_37c = local_7c / local_80;
                }
                local_78 = local_37c;
              }
            }
            puVar11 = puVar10;
            *local_150 = local_78;
            local_88 = *(int *)(puVar10 + 2);
            local_8c = local_158[1];
            local_84 = local_88;
            if (local_8c != 1) {
              if (local_8c == 2) {
                if (local_88 < 0) {
                  iVar9 = local_88 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_384 = -iVar9 / 2 + -1;
                }
                else {
                  local_384 = local_88 / 2;
                }
                local_84 = local_384;
              }
              else if (local_8c == 4) {
                if (local_88 < 0) {
                  iVar9 = local_88 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_388 = -iVar9 / 4 + -1;
                }
                else {
                  local_388 = local_88 / 4;
                }
                local_84 = local_388;
              }
              else {
                if (local_88 < 0) {
                  iVar9 = local_88 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_38c = -iVar9 / local_8c + -1;
                }
                else {
                  local_38c = local_88 / local_8c;
                }
                local_84 = local_38c;
              }
            }
            *(int *)(puVar10 + 2) = local_84;
            local_94 = *(int *)((long)puVar10 + 0x14);
            local_98 = local_158[2];
            local_90 = local_94;
            if (local_98 != 1) {
              if (local_98 == 2) {
                if (local_94 < 0) {
                  iVar9 = local_94 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_394 = -iVar9 / 2 + -1;
                }
                else {
                  local_394 = local_94 / 2;
                }
                local_90 = local_394;
              }
              else if (local_98 == 4) {
                if (local_94 < 0) {
                  iVar9 = local_94 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_398 = -iVar9 / 4 + -1;
                }
                else {
                  local_398 = local_94 / 4;
                }
                local_90 = local_398;
              }
              else {
                if (local_94 < 0) {
                  iVar9 = local_94 + 1;
                  if (iVar9 < 1) {
                    iVar9 = -iVar9;
                  }
                  local_39c = -iVar9 / local_98 + -1;
                }
                else {
                  local_39c = local_94 / local_98;
                }
                local_90 = local_39c;
              }
            }
            *(int *)((long)puVar10 + 0x14) = local_90;
            local_1a0 = (int *)((long)puVar11 + 0xc);
            local_1a8 = &local_214;
            local_174 = 0;
            local_170 = local_1a8;
            *local_1a0 = local_214.vect[0] + *local_1a0;
            local_180 = local_1a8;
            local_184 = 1;
            *(int *)(puVar11 + 2) = local_1a8->vect[1] + *(int *)(puVar11 + 2);
            local_190 = local_1a8;
            local_194 = 2;
            *(int *)((long)puVar11 + 0x14) = local_1a8->vect[2] + *(int *)((long)puVar11 + 0x14);
            uVar1 = local_2b4;
          }
        }
        local_2b4 = uVar1;
        local_230 = &local_2cc;
        local_238 = (undefined1 *)((long)&local_2b0.m_bat.m_op + 0x3c);
        local_2b0.m_bat._0_8_ = local_2cc;
        local_2b0.m_bat.m_op._4_8_ = local_2c4;
        local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[0] = local_2b4;
        local_23c = local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[1];
        in_stack_fffffffffffffc20 = &local_2b0;
        for (local_1ec = 0; local_1ec < 3; local_1ec = local_1ec + 1) {
          local_108 = &local_1dc;
          local_10c = local_1ec;
          local_64 = local_1ec;
          local_40 = local_1ec;
          bVar8 = (byte)local_1ec;
          local_1f0 = (uint)((local_2b0.m_bat.m_op.m_bndryReg.m_doihi.vect[1] & 1 << (bVar8 & 0x1f))
                            != 0);
          local_118 = (undefined1 *)((long)&local_2b0.m_bat.m_op + 0x14);
          local_11c = local_1ec;
          local_54 = local_1ec;
          local_44 = local_1ec;
          local_1f4 = (uint)((local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[0] & 1 << (bVar8 & 0x1f)
                             ) != 0);
          local_1f8 = local_1f0 - local_1f4;
          local_30 = (undefined1 *)((long)&local_2b0.m_bat.m_op + 8);
          local_34 = local_1ec;
          *(int *)(local_30 + (long)local_1ec * 4) =
               local_1f8 + *(int *)(local_30 + (long)local_1ec * 4);
          local_1d0 = (undefined1 *)((long)&local_2b0.m_bat.m_op + 0x14);
          local_1d4 = local_1ec;
          if (local_1f0 == 0) {
            local_24 = local_1ec;
            local_18 = local_1ec;
            local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[0] =
                 (1 << (bVar8 & 0x1f) ^ 0xffffffffU) &
                 local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[0];
            local_20 = local_1d0;
          }
          else {
            local_14 = local_1ec;
            local_4 = local_1ec;
            local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[0] =
                 1 << (bVar8 & 0x1f) | local_2b0.m_bat.m_op.m_bndryReg.m_loshft.vect[0];
            local_10 = local_1d0;
          }
          local_1d8 = local_1f0;
          local_60 = local_108;
          local_50 = local_118;
          local_38 = local_1f8;
        }
        local_2b0.m_bat.m_op._12_8_ = local_2bc;
        local_1e8 = in_stack_fffffffffffffc20;
        local_1dc = local_23c;
        poVar5 = amrex::operator<<((ostream *)
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                   (Box *)CONCAT44(in_stack_fffffffffffffc44,
                                                   in_stack_fffffffffffffc40));
        std::operator<<(poVar5,'\n');
      }
    }
    else {
      for (local_2d0 = 0;
          local_2d0 <
          local_2b0.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_; local_2d0 = local_2d0 + 1) {
        Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                  (&(local_2b0.m_simplified_list.
                     super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_lbox,
                   (size_type)&in_RDI->m_op);
        BATbndryReg::operator()(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        poVar5 = amrex::operator<<((ostream *)
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                   (Box *)CONCAT44(in_stack_fffffffffffffc44,
                                                   in_stack_fffffffffffffc40));
        std::operator<<(poVar5,'\n');
      }
    }
  }
  std::operator<<((ostream *)
                  local_2b0.m_simplified_list.
                  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr,')');
  uVar7 = std::ios::fail();
  if ((uVar7 & 1) != 0) {
    local_248 = "BoxArray::writeOn(ostream&) failed";
    Error_host((char *)in_stack_fffffffffffffc20);
  }
  return (ostream *)
         local_2b0.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
}

Assistant:

std::ostream&
BoxArray::writeOn (std::ostream& os) const
{
    //
    // TODO -- completely remove the fiction of a hash value.
    //
    os << '(' << size() << ' ' << 0 << '\n';

    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
        for (int i = 0; i < N; ++i) {
            os << bxs[i] << '\n';
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
        for (int i = 0; i < N; ++i) {
            os << amrex::convert(amrex::coarsen(bxs[i],cr),t) << '\n';
        }
    } else {
        for (int i = 0; i < N; ++i) {
            os << m_bat.m_op.m_bndryReg(bxs[i]) << '\n';
        }
    }

    os << ')';

    if (os.fail())
        amrex::Error("BoxArray::writeOn(ostream&) failed");

    return os;
}